

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_util.cpp
# Opt level: O2

int BmsUtil::IsFileUTF8(string *filename)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  iconv_t __cd;
  int *piVar3;
  BmsFileOpenException *this;
  uint *puVar4;
  int iVar5;
  bool bVar6;
  char *but_out_iconv;
  ICONVCHR *buf_iconv;
  size_t len_char_out;
  size_t len_char;
  char buf_char [10240];
  char buf_char_out [10240];
  
  __stream = fopen((filename->_M_dataplus)._M_p,"r");
  if (__stream == (FILE *)0x0) {
    this = (BmsFileOpenException *)__cxa_allocate_exception(0x30);
    puVar4 = (uint *)__errno_location();
    BmsFileOpenException::BmsFileOpenException(this,filename,*puVar4);
    __cxa_throw(this,&BmsFileOpenException::typeinfo,BmsFileOpenException::~BmsFileOpenException);
  }
  fseek(__stream,0,0);
  sVar2 = fread(buf_char,1,3,__stream);
  iVar5 = 1;
  if ((sVar2 != 3) || (iVar1 = bcmp(buf_char,utf8BOM,3), iVar1 != 0)) {
    fseek(__stream,0,0);
    __cd = iconv_open("UTF-8","Shift_JIS");
    if (__cd == (iconv_t)0xffffffffffffffff) {
      iVar5 = -1;
    }
    else {
      piVar3 = __errno_location();
      *piVar3 = 0;
      iVar5 = 10;
      do {
        bVar6 = iVar5 == 0;
        iVar5 = iVar5 + -1;
        if ((bVar6) || (iVar1 = feof(__stream), iVar1 != 0)) {
          iconv_close(__cd);
          return 0;
        }
        fgets(buf_char,0x2800,__stream);
        len_char = strlen(buf_char);
        but_out_iconv = buf_char_out;
        len_char_out = 0x2800;
        buf_iconv = buf_char;
        sVar2 = iconv(__cd,&buf_iconv,&len_char,&but_out_iconv,&len_char_out);
        but_out_iconv[1] = '\0';
        *but_out_iconv = '\0';
      } while ((*piVar3 == 0) && ((sVar2 & 0x80000000) == 0));
      iconv_close(__cd);
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

int BmsUtil::IsFileUTF8(const std::string& filename) {
	FILE *file;
	if (!OpenFile(&file, filename.c_str(), "r"))
		throw BmsFileOpenException(filename, errno);

	// buffers
	char buf_char[BmsConst::BMS_MAX_LINE_BUFFER];
	char buf_char_out[BmsConst::BMS_MAX_LINE_BUFFER];
	size_t len_char, len_char_out;

	// check 4 byte to see is it UTF8 BOM
	fseek(file, 0, SEEK_SET);
	if (fread(buf_char, 1, 3, file) == 3 && memcmp(buf_char, utf8BOM, 3) == 0) {
		return true;
	}
	// attempt to convert few lines
	fseek(file, 0, SEEK_SET);
	iconv_t cd = iconv_open(BmsBelOption::DEFAULT_UNICODE_ENCODING, BmsBelOption::DEFAULT_FALLBACK_ENCODING);
	if (cd == (void*)-1) {
		// conversion is not supported
		return -1;
	}
	errno = 0;
	for (int i = 0; i < BmsBelOption::CONVERT_ATTEMPT_LINES && NOT(feof(file)); i++) {
		fgets(buf_char, BmsConst::BMS_MAX_LINE_BUFFER, file);
		len_char = strlen(buf_char);
		ICONVCHR *buf_iconv = (ICONVCHR*)buf_char;
		char *but_out_iconv = (char*)buf_char_out;
		len_char_out = BmsConst::BMS_MAX_LINE_BUFFER;		// available characters for converting
		int iconv_ret = iconv(cd, &buf_iconv, &len_char, &but_out_iconv, &len_char_out);
		*but_out_iconv = *(but_out_iconv + 1) = 0;		// NULL terminal character
		if (errno || iconv_ret < 0) {
			iconv_close(cd);
			return 1;	// failed to convert Shift_JIS. maybe UTF-8?
		}
	}
	iconv_close(cd);
	return 0;
}